

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

void okim6295_w(void *chip,UINT8 offset,UINT8 data)

{
  code *pcVar1;
  undefined8 uVar2;
  UINT32 UVar3;
  okim6295_state *info;
  UINT8 data_local;
  UINT8 offset_local;
  void *chip_local;
  
  switch(offset) {
  case '\0':
    okim6295_write_command((okim6295_state *)chip,data);
    break;
  case '\b':
  case '\t':
  case '\n':
    *(UINT8 *)((long)chip + (long)(int)(offset & 3) + 0xf4) = data;
    break;
  case '\v':
    *(UINT8 *)((long)chip + (long)(int)(offset & 3) + 0xf4) = data;
    okim6295_set_clock(chip,0);
    if (*(long *)((long)chip + 0x108) != 0) {
      pcVar1 = *(code **)((long)chip + 0x108);
      uVar2 = *(undefined8 *)((long)chip + 0x110);
      UVar3 = okim6295_get_rate(chip);
      (*pcVar1)(uVar2,UVar3);
    }
    break;
  case '\f':
    okim6295_set_pin7((okim6295_state *)chip,data);
    break;
  case '\x0e':
    *(UINT8 *)((long)chip + 0xea) = data;
    break;
  case '\x0f':
    okim6295_set_bank_base((okim6295_state *)chip,(uint)data << 0x12);
    break;
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    *(UINT8 *)((long)chip + (long)(int)(offset & 3) + 0xeb) = data;
  }
  return;
}

Assistant:

static void okim6295_w(void* chip, UINT8 offset, UINT8 data)
{
	okim6295_state *info = (okim6295_state *)chip;
	
	switch(offset)
	{
	case 0x00:
		okim6295_write_command(info, data);
		break;
	case 0x08:
	case 0x09:
	case 0x0A:
		info->clock_buffer[offset & 0x03] = data;
		break;
	case 0x0B:
		info->clock_buffer[offset & 0x03] = data;
		okim6295_set_clock(chip, 0);	// refresh clock from clock_buffer
		if (info->SmpRateFunc != NULL)
			info->SmpRateFunc(info->SmpRateData, okim6295_get_rate(chip));
		break;
	case 0x0C:
		okim6295_set_pin7(info, data);
		break;
	case 0x0E:	// NMK112 bank switch enable
		info->nmk_mode = data;
		break;
	case 0x0F:
		okim6295_set_bank_base(info, data << 18);
		break;
	case 0x10:
	case 0x11:
	case 0x12:
	case 0x13:
		info->nmk_bank[offset & 0x03] = data;
		break;
	}
	
	return;
}